

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_logging.h
# Opt level: O2

void __thiscall
google::
PrintSequence<__gnu_cxx::_Hashtable_const_iterator<int,int,__gnu_cxx::hash<int>,std::_Identity<int>,std::equal_to<int>,std::allocator<int>>>
          (google *this,ostream *out,
          _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
          begin,_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                end)

{
  int i;
  uint uVar1;
  undefined1 local_40 [8];
  _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
  begin_local;
  
  begin_local._M_cur = begin._M_cur;
  local_40 = (undefined1  [8])out;
  for (uVar1 = 0; (local_40 != (undefined1  [8])begin._M_ht && (uVar1 < 100)); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<((ostream *)this,' ');
    }
    std::ostream::operator<<
              (this,*(int *)&(((_Vector_type *)((long)local_40 + 8))->
                             super__Safe_container<std::__debug::vector<__gnu_cxx::_Hashtable_node<int>_*,_std::allocator<__gnu_cxx::_Hashtable_node<int>_*>_>,_std::allocator<__gnu_cxx::_Hashtable_node<int>_*>,___gnu_debug::_Safe_sequence,_true>
                             ).
                             super__Safe_sequence<std::__debug::vector<__gnu_cxx::_Hashtable_node<int>_*,_std::allocator<__gnu_cxx::_Hashtable_node<int>_*>_>_>
                             .super__Safe_sequence_base._M_iterators);
    __gnu_cxx::
    _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::operator++((_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *)local_40);
  }
  if (local_40 != (undefined1  [8])begin._M_ht) {
    std::operator<<((ostream *)this," ...");
  }
  return;
}

Assistant:

inline void PrintSequence(std::ostream& out, Iter begin, Iter end) {
  // Output at most 100 elements -- appropriate if used for logging.
  for (int i = 0; begin != end && i < 100; ++i, ++begin) {
    if (i > 0) out << ' ';
    out << *begin;
  }
  if (begin != end) {
    out << " ...";
  }
}